

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPUDPv4Transmitter::AddDestination(RTPUDPv4Transmitter *this,RTPAddress *addr)

{
  RTPMemoryManager *pRVar1;
  HashElement *pHVar2;
  bool bVar3;
  int iVar4;
  HashElement *pHVar5;
  sa_family_t sVar6;
  ushort uVar7;
  in_port_t iVar8;
  uint uVar9;
  uint uVar10;
  in_addr_t iVar11;
  
  iVar4 = -0x5a;
  if ((this->init == true) && (iVar4 = -0x59, this->created == true)) {
    uVar10 = 0;
    sVar6 = 0;
    iVar8 = 0;
    iVar11 = 0;
    uVar7 = 0;
    if (addr->addresstype == IPv4Address) {
      uVar7 = *(ushort *)((long)&addr[1]._vptr_RTPAddress + 2);
      uVar10 = *(uint *)&addr->field_0xc;
      iVar8 = *(ushort *)&addr[1]._vptr_RTPAddress << 8 | *(ushort *)&addr[1]._vptr_RTPAddress >> 8;
      iVar11 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      uVar7 = uVar7 << 8 | uVar7 >> 8;
      sVar6 = 2;
    }
    iVar4 = -0x54;
    if (addr->addresstype == IPv4Address) {
      uVar9 = uVar10 % 0x207d;
      pHVar5 = (this->destinations).table[uVar9];
      if (pHVar5 != (HashElement *)0x0) {
        bVar3 = false;
        do {
          if (((pHVar5->element).rtpaddr.sin_addr.s_addr == iVar11) &&
             ((pHVar5->element).rtpaddr.sin_port == iVar8)) {
            bVar3 = true;
          }
          else {
            pHVar5 = pHVar5->hashnext;
          }
        } while ((!bVar3) && (pHVar5 != (HashElement *)0x0));
        if (bVar3) {
          return -4;
        }
      }
      pRVar1 = (this->destinations).super_RTPMemoryObject.mgr;
      if (pRVar1 == (RTPMemoryManager *)0x0) {
        pHVar5 = (HashElement *)operator_new(0x48);
      }
      else {
        pHVar5 = (HashElement *)
                 (**(code **)(*(long *)pRVar1 + 0x10))(pRVar1,0x48,(this->destinations).memorytype);
      }
      (pHVar5->element).ip = uVar10;
      (pHVar5->element).rtpaddr.sin_family = sVar6;
      (pHVar5->element).rtpaddr.sin_port = iVar8;
      (pHVar5->element).rtpaddr.sin_addr.s_addr = iVar11;
      (pHVar5->element).rtpaddr.sin_zero[0] = '\0';
      (pHVar5->element).rtpaddr.sin_zero[1] = '\0';
      (pHVar5->element).rtpaddr.sin_zero[2] = '\0';
      (pHVar5->element).rtpaddr.sin_zero[3] = '\0';
      (pHVar5->element).rtpaddr.sin_zero[4] = '\0';
      (pHVar5->element).rtpaddr.sin_zero[5] = '\0';
      (pHVar5->element).rtpaddr.sin_zero[6] = '\0';
      (pHVar5->element).rtpaddr.sin_zero[7] = '\0';
      (pHVar5->element).rtcpaddr.sin_family = sVar6;
      (pHVar5->element).rtcpaddr.sin_port = uVar7;
      (pHVar5->element).rtcpaddr.sin_addr.s_addr = iVar11;
      (pHVar5->element).rtcpaddr.sin_zero[0] = '\0';
      (pHVar5->element).rtcpaddr.sin_zero[1] = '\0';
      (pHVar5->element).rtcpaddr.sin_zero[2] = '\0';
      (pHVar5->element).rtcpaddr.sin_zero[3] = '\0';
      (pHVar5->element).rtcpaddr.sin_zero[4] = '\0';
      (pHVar5->element).rtcpaddr.sin_zero[5] = '\0';
      (pHVar5->element).rtcpaddr.sin_zero[6] = '\0';
      (pHVar5->element).rtcpaddr.sin_zero[7] = '\0';
      pHVar5->hashprev = (HashElement *)0x0;
      pHVar5->hashnext = (HashElement *)0x0;
      pHVar5->listprev = (HashElement *)0x0;
      pHVar5->listnext = (HashElement *)0x0;
      pHVar5->hashindex = uVar9;
      pHVar2 = (this->destinations).table[uVar9];
      (this->destinations).table[uVar9] = pHVar5;
      pHVar5->hashnext = pHVar2;
      if (pHVar2 != (HashElement *)0x0) {
        pHVar2->hashprev = pHVar5;
      }
      if ((this->destinations).firsthashelem == (HashElement *)0x0) {
        (this->destinations).firsthashelem = pHVar5;
      }
      else {
        pHVar2 = (this->destinations).lasthashelem;
        pHVar2->listnext = pHVar5;
        pHVar5->listprev = pHVar2;
      }
      (this->destinations).lasthashelem = pHVar5;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int RTPUDPv4Transmitter::AddDestination(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;
	
	MAINMUTEX_LOCK

	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}

	RTPIPv4Destination dest;
	if (!RTPIPv4Destination::AddressToDestination(addr, dest))
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_INVALIDADDRESSTYPE;
	}
	
	int status = destinations.AddElement(dest);

	MAINMUTEX_UNLOCK
	return status;
}